

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.h
# Opt level: O2

void UnitTest::_UnitTest_Compare::printFirst(void)

{
  char *pcVar1;
  ostream *poVar2;
  
  if (DAT_00107178 != '\0') {
    return;
  }
  pcVar1 = _unittest_fail();
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar1);
  std::operator<<(poVar2,anon_var_dwarf_3a83);
  return;
}

Assistant:

static void printFirst() {  // {{{2
    if (!global_unit_test_object_.vim_lines) {
      std::cout << _unittest_fail() << "┍ ";
    }
  }